

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void divide_subset_split<float,unsigned_long>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,double split_point,MissingAction missing_action,
               size_t *st_NA,size_t *end_NA,size_t *split_ix)

{
  ulong uVar1;
  unsigned_long *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  unsigned_long *puVar10;
  unsigned_long *puVar11;
  ulong uVar12;
  ulong *puVar13;
  size_t *psVar14;
  ulong *puVar15;
  size_t *r;
  ulong uVar16;
  bool bVar17;
  size_t local_80;
  
  uVar16 = Xc_indptr[col_num];
  uVar5 = Xc_indptr[col_num + 1];
  if (uVar16 == uVar5) {
    sVar9 = end + 1;
    if (split_point < 0.0) {
      sVar9 = st;
    }
    psVar14 = split_ix;
    if (missing_action != Fail) {
      *st_NA = sVar9;
      psVar14 = end_NA;
    }
    *psVar14 = sVar9;
  }
  uVar6 = Xc_ind[uVar5 - 1];
  puVar4 = ix_arr + end + 1;
  puVar10 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                      (ix_arr + st,puVar4,Xc_ind + uVar16);
  uVar1 = uVar5 - 1;
  puVar2 = Xc_ind + uVar5;
  local_80 = (long)puVar10 - (long)ix_arr >> 3;
  if (puVar10 <= ix_arr + st) {
    local_80 = st;
  }
  puVar3 = ix_arr + end;
  if (split_point < 0.0) {
    local_80 = st;
  }
  if (missing_action == Fail) {
    sVar9 = st;
    if (split_point < 0.0) {
      do {
        local_80 = sVar9;
        puVar13 = Xc_ind + uVar16;
        while( true ) {
          if (((puVar10 == puVar4) || (uVar16 == uVar5)) || (uVar12 = *puVar10, uVar6 < uVar12))
          goto LAB_002c0e08;
          if (*puVar13 == uVar12) {
            if ((double)Xc[uVar16] <= split_point) {
              uVar7 = ix_arr[local_80];
              ix_arr[local_80] = uVar12;
              *puVar10 = uVar7;
              local_80 = local_80 + 1;
            }
            if ((puVar10 == puVar3) || (uVar16 == uVar1)) goto LAB_002c0e08;
            puVar10 = puVar10 + 1;
            puVar11 = std::
                      __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                (puVar13 + 1,puVar2,puVar10);
            goto LAB_002c0de5;
          }
          if (*puVar13 <= uVar12) break;
          puVar10 = std::
                    __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                              (puVar10 + 1,puVar4,puVar13);
        }
        puVar11 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                            (puVar13 + 1,puVar2,puVar10);
LAB_002c0de5:
        uVar16 = (long)puVar11 - (long)Xc_ind >> 3;
        sVar9 = local_80;
      } while( true );
    }
    do {
      puVar13 = Xc_ind + uVar16;
      while( true ) {
        if (puVar10 == puVar4) goto LAB_002c0e08;
        if (uVar5 <= uVar16) goto LAB_002c0e22;
        uVar6 = *puVar13;
        if (uVar6 == *puVar10) {
          if ((double)Xc[uVar16] <= split_point) {
            uVar12 = ix_arr[local_80];
            ix_arr[local_80] = uVar6;
            *puVar10 = uVar12;
            local_80 = local_80 + 1;
          }
          if ((uVar16 == uVar1) && (puVar15 = puVar10, puVar10 < puVar3)) {
            while (puVar15 = puVar15 + 1, puVar15 <= puVar3) {
              uVar6 = ix_arr[local_80];
              ix_arr[local_80] = *puVar15;
              *puVar15 = uVar6;
              local_80 = local_80 + 1;
            }
          }
          if ((uVar16 == uVar1) || (puVar10 == puVar3)) goto LAB_002c0e08;
          puVar10 = puVar10 + 1;
          puVar11 = std::
                    __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                              (puVar13 + 1,puVar2,puVar10);
          goto LAB_002c0b15;
        }
        if (uVar6 <= *puVar10) break;
        for (; (puVar10 <= puVar3 && (*puVar10 < *puVar13)); puVar10 = puVar10 + 1) {
          uVar6 = ix_arr[local_80];
          ix_arr[local_80] = *puVar10;
          *puVar10 = uVar6;
          local_80 = local_80 + 1;
        }
      }
      puVar11 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                          (puVar13 + 1,puVar2,puVar10);
LAB_002c0b15:
      uVar16 = (long)puVar11 - (long)Xc_ind >> 3;
    } while( true );
  }
  if (0.0 <= split_point) {
    bVar17 = false;
    uVar12 = uVar16;
    do {
      puVar13 = Xc_ind + uVar12;
LAB_002c0901:
      if (puVar10 == puVar4) goto LAB_002c0c18;
      if (uVar5 <= uVar12) goto LAB_002c0a08;
      uVar7 = *puVar13;
      if (uVar7 == *puVar10) {
        if (NAN(Xc[uVar12])) {
          bVar17 = true;
        }
        else if ((double)Xc[uVar12] <= split_point) {
          uVar8 = ix_arr[local_80];
          ix_arr[local_80] = uVar7;
          *puVar10 = uVar8;
          local_80 = local_80 + 1;
        }
        if ((uVar12 == uVar1) && (puVar15 = puVar10, puVar10 < puVar3)) {
          while (puVar15 = puVar15 + 1, puVar15 <= puVar3) {
            uVar7 = ix_arr[local_80];
            ix_arr[local_80] = *puVar15;
            *puVar15 = uVar7;
            local_80 = local_80 + 1;
          }
        }
        if ((uVar12 != uVar1) && (puVar10 != puVar3)) {
          puVar10 = puVar10 + 1;
          puVar11 = std::
                    __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                              (puVar13 + 1,puVar2,puVar10);
          goto LAB_002c09d2;
        }
        goto LAB_002c0c18;
      }
      if (*puVar10 < uVar7) goto LAB_002c0922;
      puVar11 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                          (puVar13 + 1,puVar2,puVar10);
LAB_002c09d2:
      uVar12 = (long)puVar11 - (long)Xc_ind >> 3;
    } while( true );
  }
  bVar17 = false;
  uVar12 = uVar16;
  local_80 = st;
  do {
    puVar13 = Xc_ind + uVar12;
    while( true ) {
      if (((puVar10 == puVar4) || (uVar12 == uVar5)) || (uVar7 = *puVar10, uVar6 < uVar7))
      goto LAB_002c0c18;
      if (*puVar13 == uVar7) {
        if (NAN(Xc[uVar12])) {
          bVar17 = true;
        }
        else if ((double)Xc[uVar12] <= split_point) {
          uVar8 = ix_arr[local_80];
          ix_arr[local_80] = uVar7;
          *puVar10 = uVar8;
          local_80 = local_80 + 1;
        }
        if ((puVar10 == puVar3) || (uVar12 == uVar1)) goto LAB_002c0c18;
        puVar10 = puVar10 + 1;
        puVar11 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                            (puVar13 + 1,puVar2,puVar10);
        goto LAB_002c0bee;
      }
      if (*puVar13 <= uVar7) break;
      puVar10 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                          (puVar10 + 1,puVar4,puVar13);
    }
    puVar11 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                        (puVar13 + 1,puVar2,puVar10);
LAB_002c0bee:
    uVar12 = (long)puVar11 - (long)Xc_ind >> 3;
  } while( true );
LAB_002c0a08:
  for (; puVar10 <= puVar3; puVar10 = puVar10 + 1) {
    uVar12 = ix_arr[local_80];
    ix_arr[local_80] = *puVar10;
    *puVar10 = uVar12;
    local_80 = local_80 + 1;
  }
LAB_002c0c18:
  *st_NA = local_80;
  if (!bVar17) {
LAB_002c0d0b:
    *end_NA = local_80;
    return;
  }
  puVar13 = ix_arr + local_80;
  std::__sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(puVar13);
  do {
    puVar15 = Xc_ind + uVar16;
    while( true ) {
      if (((puVar13 == puVar4) || (uVar16 == uVar5)) || (uVar12 = *puVar13, uVar6 < uVar12))
      goto LAB_002c0d0b;
      if (*puVar15 == uVar12) {
        if (NAN(Xc[uVar16])) {
          uVar7 = ix_arr[local_80];
          ix_arr[local_80] = uVar12;
          *puVar13 = uVar7;
          local_80 = local_80 + 1;
        }
        if ((puVar13 == puVar3) || (uVar16 == uVar1)) goto LAB_002c0d0b;
        puVar13 = puVar13 + 1;
        puVar10 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                            (puVar15 + 1,puVar2,puVar13);
        goto LAB_002c0cd8;
      }
      if (*puVar15 <= uVar12) break;
      puVar13 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                          (puVar13 + 1,puVar4,puVar15);
    }
    puVar10 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                        (puVar15 + 1,puVar2,puVar13);
LAB_002c0cd8:
    uVar16 = (long)puVar10 - (long)Xc_ind >> 3;
  } while( true );
LAB_002c0922:
  for (; (puVar10 <= puVar3 && (*puVar10 < *puVar13)); puVar10 = puVar10 + 1) {
    uVar7 = ix_arr[local_80];
    ix_arr[local_80] = *puVar10;
    *puVar10 = uVar7;
    local_80 = local_80 + 1;
  }
  goto LAB_002c0901;
LAB_002c0e22:
  for (; puVar10 <= puVar3; puVar10 = puVar10 + 1) {
    uVar16 = ix_arr[local_80];
    ix_arr[local_80] = *puVar10;
    *puVar10 = uVar16;
    local_80 = local_80 + 1;
  }
LAB_002c0e08:
  *split_ix = local_80;
  return;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                         real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr, double split_point,
                         MissingAction missing_action, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    /* TODO: this is a mess, needs refactoring */
    /* TODO: when moving zeros, would be better to instead move by '>' (opposite as in here) */
    /* TODO: should create an extra version to go along with 'predict' that would
       add the range penalty right here to spare operations. */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        if (missing_action == Fail)
        {
            split_ix = (0 <= split_point)? (end+1) : st;
        }

        else
        {
            st_NA  = (0 <= split_point)? (end+1) : st;
            end_NA = (0 <= split_point)? (end+1) : st;
        }

    }

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t temp;
    bool   move_zeros = 0 <= split_point;
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    if (move_zeros && ptr_st > ix_arr + st)
        st = ptr_st - ix_arr;

    if (missing_action == Fail)
    {
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                    {
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        split_ix = st;
    }

    else /* can have NAs */
    {

        bool has_NAs = false;
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                        has_NAs = true;
                    else if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                    {
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                    }
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos]))) has_NAs = true;
                    if (!std::isnan(Xc[curr_pos]) && Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }


        st_NA = st;
        if (has_NAs)
        {
            curr_pos = st_col;
            std::sort(ix_arr + st, ix_arr + end + 1);
            for (size_t *row = ix_arr + st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }
        end_NA = st;

    }

}